

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O0

void test_contains_all(void)

{
  bitset_t *b1;
  bitset_t *b2;
  int i;
  unsigned_long unaff_retaddr;
  bitset_t *subset;
  bitset_t *superset;
  undefined4 in_stack_ffffffffffffffe8;
  int line;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (line = 0; line < 1000; line = line + 1) {
    bitset_set(b2,CONCAT44(line,in_stack_ffffffffffffffe8));
    if (line % 2 == 0) {
      bitset_set(b2,CONCAT44(line,in_stack_ffffffffffffffe8));
    }
  }
  bitset_contains_all(b1,b2);
  _assert_true(unaff_retaddr,(char *)b1,(char *)b2,line);
  bitset_contains_all(b1,b2);
  _assert_true(unaff_retaddr,(char *)b1,(char *)b2,line);
  bitset_set(b2,CONCAT44(line,in_stack_ffffffffffffffe8));
  bitset_contains_all(b1,b2);
  _assert_true(unaff_retaddr,(char *)b1,(char *)b2,line);
  bitset_contains_all(b1,b2);
  _assert_true(unaff_retaddr,(char *)b1,(char *)b2,line);
  bitset_free((bitset_t *)0x1034e2);
  bitset_free((bitset_t *)0x1034ec);
  return;
}

Assistant:

DEFINE_TEST(test_contains_all) {
    bitset_t *superset = bitset_create();
    bitset_t *subset = bitset_create();

    for (int i = 0; i < 1000; i++) {
        bitset_set(superset, i);
        if (i % 2 == 0) bitset_set(subset, i);
    }

    assert_true(bitset_contains_all(superset, subset));
    assert_true(!bitset_contains_all(subset, superset));

    bitset_set(subset, 1001);

    assert_true(!bitset_contains_all(superset, subset));
    assert_true(!bitset_contains_all(subset, superset));

    bitset_free(superset);
    bitset_free(subset);
}